

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::anon_unknown_59::InMemoryDirectory::SymlinkNode::parse
          (Path *__return_storage_ptr__,SymlinkNode *this)

{
  size_t sVar1;
  size_t in_RCX;
  Path *this_00;
  StringPtr path;
  anon_class_8_1_8991fb9c _kjContextFunc1447;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1447:7)>
  _kjContext1447;
  SymlinkNode *local_78;
  Context local_70;
  undefined1 *local_28;
  
  local_78 = this;
  kj::_::Debug::Context::Context(&local_70);
  local_70.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0028ff60;
  sVar1 = (this->content).content.size_;
  if (sVar1 == 0) {
    this_00 = (Path *)0x237f1b;
  }
  else {
    this_00 = (Path *)(this->content).content.ptr;
  }
  path.content.ptr = (char *)(sVar1 + (sVar1 == 0));
  path.content.size_ = in_RCX;
  local_28 = (undefined1 *)&local_78;
  Path::parse(__return_storage_ptr__,this_00,path);
  kj::_::Debug::Context::~Context(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Path parse() const {
      KJ_CONTEXT("parsing symlink", content);
      return Path::parse(content);
    }